

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

void __thiscall Clasp::SharedContext::~SharedContext(SharedContext *this)

{
  Solver *pSVar1;
  bool bVar2;
  reference ppSVar3;
  long in_RDI;
  Solver *in_stack_ffffffffffffffd0;
  OutputTable *this_00;
  
  while( true ) {
    bVar2 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::empty
                      ((pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_> *)
                       (in_RDI + 0xe8));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppSVar3 = bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::back
                        ((pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_> *)
                         (in_RDI + 0xe8));
    pSVar1 = *ppSVar3;
    if (pSVar1 != (Solver *)0x0) {
      Solver::~Solver(in_stack_ffffffffffffffd0);
      operator_delete(pSVar1);
    }
    bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::pop_back
              ((pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_> *)(in_RDI + 0xe8));
  }
  this_00 = *(OutputTable **)(in_RDI + 0xf8);
  if (this_00 != (OutputTable *)0x0) {
    Minimize::~Minimize((Minimize *)this_00);
    operator_delete(this_00);
  }
  bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::~pod_vector
            ((pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_> *)0x1d4556);
  SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::Configuration,_Clasp::DeleteObject> *)0x1d4567);
  ShortImplicationsGraph::~ShortImplicationsGraph((ShortImplicationsGraph *)this_00);
  bk_lib::pod_vector<Clasp::VarInfo,_std::allocator<Clasp::VarInfo>_>::~pod_vector
            ((pod_vector<Clasp::VarInfo,_std::allocator<Clasp::VarInfo>_> *)0x1d4589);
  SingleOwnerPtr<Clasp::Distributor,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::Distributor,_Clasp::DeleteObject> *)0x1d459a);
  DomainTable::~DomainTable((DomainTable *)0x1d45a8);
  OutputTable::~OutputTable(this_00);
  SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::ExtDepGraph,_Clasp::DeleteObject> *)0x1d45c4);
  SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::Asp::PrgDepGraph,_Clasp::DeleteObject> *)0x1d45d2);
  SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject> *)0x1d45dc);
  return;
}

Assistant:

SharedContext::~SharedContext() {
	while (!solvers_.empty()) { delete solvers_.back(); solvers_.pop_back(); }
	delete mini_;
}